

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# score.c
# Opt level: O0

void enter_score(player *p,time_t *death_time)

{
  int iVar1;
  undefined1 local_31d8 [8];
  high_score scores [100];
  high_score entry;
  wchar_t j;
  time_t *death_time_local;
  player *p_local;
  
  entry.how[0x18] = '\0';
  entry.how[0x19] = '\0';
  entry.how[0x1a] = '\0';
  entry.how[0x1b] = '\0';
  while( true ) {
    if (0x2c < (int)entry.how._24_4_) {
      if ((p->noscore & 10) == 0) {
        if ((p->noscore & 0x20) == 0) {
          if ((p->total_winner == 0) && (iVar1 = strcmp(p->died_from,"Interrupting"), iVar1 == 0)) {
            msg("Score not registered due to interruption.");
            event_signal(EVENT_MESSAGE_FLUSH);
          }
          else if ((p->total_winner == 0) && (iVar1 = strcmp(p->died_from,"Retiring"), iVar1 == 0))
          {
            msg("Score not registered due to retiring.");
            event_signal(EVENT_MESSAGE_FLUSH);
          }
          else {
            build_score((high_score *)(scores[99].how + 0x1e),p,p->died_from,death_time);
            highscore_read((high_score *)local_31d8,100);
            highscore_add((high_score *)(scores[99].how + 0x1e),(high_score *)local_31d8,100);
            highscore_write((high_score *)local_31d8,100);
          }
        }
        else {
          msg("Score not registered for borgs.");
          event_signal(EVENT_MESSAGE_FLUSH);
        }
      }
      else {
        msg("Score not registered for wizards.");
        event_signal(EVENT_MESSAGE_FLUSH);
      }
      return;
    }
    iVar1 = option_type(entry.how._24_4_);
    if ((iVar1 == 3) && (((p->opts).opt[(int)entry.how._24_4_] & 1U) != 0)) break;
    entry.how._24_4_ = entry.how._24_4_ + 1;
  }
  msg("Score not registered for cheaters.");
  event_signal(EVENT_MESSAGE_FLUSH);
  return;
}

Assistant:

void enter_score(const struct player *p, const time_t *death_time)
{
	int j;

	/* Cheaters are not scored */
	for (j = 0; j < OPT_MAX; ++j) {
		if (option_type(j) != OP_SCORE)
			continue;
		if (!p->opts.opt[j])
			continue;

		msg("Score not registered for cheaters.");
		event_signal(EVENT_MESSAGE_FLUSH);
		return;
	}

	/* Add a new entry, if allowed */
	if (p->noscore & (NOSCORE_WIZARD | NOSCORE_DEBUG)) {
		msg("Score not registered for wizards.");
		event_signal(EVENT_MESSAGE_FLUSH);
#ifdef ALLOW_BORG
#ifndef SCORE_BORGS
	}	else if (p->noscore & (NOSCORE_BORG)) {
		msg("Score not registered for borgs.");
		event_signal(EVENT_MESSAGE_FLUSH);
#endif
#endif
	} else if (!p->total_winner && streq(p->died_from, "Interrupting")) {
		msg("Score not registered due to interruption.");
		event_signal(EVENT_MESSAGE_FLUSH);
	} else if (!p->total_winner && streq(p->died_from, "Retiring")) {
		msg("Score not registered due to retiring.");
		event_signal(EVENT_MESSAGE_FLUSH);
	} else {
		struct high_score entry;
		struct high_score scores[MAX_HISCORES];

		build_score(&entry, p, p->died_from, death_time);

		highscore_read(scores, N_ELEMENTS(scores));
		highscore_add(&entry, scores, N_ELEMENTS(scores));
		highscore_write(scores, N_ELEMENTS(scores));
	}

	/* Success */
	return;
}